

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_set.hxx
# Opt level: O1

iterator __thiscall
cmsys::hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_>::begin
          (hash_set<int,_cmsys::hash<int>,_std::equal_to<int>,_std::allocator<char>_> *this)

{
  pointer pp_Var1;
  _Hashtable_node<int> *p_Var2;
  long lVar3;
  long lVar4;
  iterator iVar5;
  
  pp_Var1 = (this->_M_ht)._M_buckets.
            super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_M_ht)._M_buckets.
                super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      p_Var2 = pp_Var1[lVar4];
      if (p_Var2 != (_Hashtable_node<int> *)0x0) goto LAB_001184b0;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  p_Var2 = (_Hashtable_node<int> *)0x0;
LAB_001184b0:
  iVar5._M_ht = &this->_M_ht;
  iVar5._M_cur = p_Var2;
  return iVar5;
}

Assistant:

iterator begin() const { return _M_ht.begin(); }